

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::restriction
          (MLEBABecLap *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  int in_ESI;
  long *in_RDI;
  int ncomp;
  IntVect ratio;
  IntVect *in_stack_000007e8;
  int in_stack_000007f0;
  int in_stack_000007f4;
  MultiFab *in_stack_000007f8;
  MultiFab *in_stack_00000800;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  if (in_ESI < 1) {
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)in_RDI);
  }
  else {
    IntVect::IntVect((IntVect *)&stack0xffffffffffffffd4,2);
  }
  (**(code **)(*in_RDI + 0x28))();
  EB_average_down(in_stack_00000800,in_stack_000007f8,in_stack_000007f4,in_stack_000007f0,
                  in_stack_000007e8);
  return;
}

Assistant:

void
MLEBABecLap::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[cmglev-1];
    const int ncomp = getNComp();
    amrex::EB_average_down(fine, crse, 0, ncomp, ratio);
}